

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_on_altsvc_received(nghttp2_session *session,nghttp2_frame *frame)

{
  size_t sVar1;
  int iVar2;
  nghttp2_stream *pnVar3;
  nghttp2_stream *stream;
  nghttp2_ext_altsvc *altsvc;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  sVar1 = (frame->data).padlen;
  if ((frame->hd).stream_id == 0) {
    if (*(long *)(sVar1 + 8) == 0) {
      iVar2 = session_call_on_invalid_frame_recv_callback(session,frame,-0x1f9);
      return iVar2;
    }
  }
  else {
    if (*(long *)(sVar1 + 8) != 0) {
      iVar2 = session_call_on_invalid_frame_recv_callback(session,frame,-0x1f9);
      return iVar2;
    }
    pnVar3 = nghttp2_session_get_stream(session,(frame->hd).stream_id);
    if (pnVar3 == (nghttp2_stream *)0x0) {
      return 0;
    }
    if (pnVar3->state == NGHTTP2_STREAM_CLOSING) {
      return 0;
    }
  }
  if (*(long *)(sVar1 + 0x18) == 0) {
    session_local._4_4_ = session_call_on_invalid_frame_recv_callback(session,frame,-0x1f9);
  }
  else {
    session_local._4_4_ = session_call_on_frame_received(session,frame);
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_on_altsvc_received(nghttp2_session *session,
                                       nghttp2_frame *frame) {
  nghttp2_ext_altsvc *altsvc;
  nghttp2_stream *stream;

  altsvc = frame->ext.payload;

  /* session->server case has been excluded */

  if (frame->hd.stream_id == 0) {
    if (altsvc->origin_len == 0) {
      return session_call_on_invalid_frame_recv_callback(session, frame,
                                                         NGHTTP2_ERR_PROTO);
    }
  } else {
    if (altsvc->origin_len > 0) {
      return session_call_on_invalid_frame_recv_callback(session, frame,
                                                         NGHTTP2_ERR_PROTO);
    }

    stream = nghttp2_session_get_stream(session, frame->hd.stream_id);
    if (!stream) {
      return 0;
    }

    if (stream->state == NGHTTP2_STREAM_CLOSING) {
      return 0;
    }
  }

  if (altsvc->field_value_len == 0) {
    return session_call_on_invalid_frame_recv_callback(session, frame,
                                                       NGHTTP2_ERR_PROTO);
  }

  return session_call_on_frame_received(session, frame);
}